

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolver.hpp
# Opt level: O0

void __thiscall soplex::SPxSolverBase<double>::setPricing(SPxSolverBase<double> *this,Pricing pr)

{
  Type TVar1;
  Pricing in_ESI;
  SPxSolverBase<double> *in_RDI;
  SPxSolverBase<double> *unaff_retaddr;
  SPxSolverBase<double> *in_stack_00000070;
  
  in_RDI->thePricing = in_ESI;
  if ((in_RDI->initialized & 1U) != 0) {
    TVar1 = type(in_RDI);
    if (TVar1 == ENTER) {
      computePvec(unaff_retaddr);
      computeCoTest(in_stack_00000070);
      computeTest(in_stack_00000070);
    }
  }
  return;
}

Assistant:

void SPxSolverBase<R>::setPricing(Pricing pr)
   {
      thePricing = pr;

      if(initialized && type() == ENTER)
      {
         computePvec();
         computeCoTest();
         computeTest();
      }
   }